

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O2

Vector2D __thiscall CGL::UniformGridSampler2D::get_sample(UniformGridSampler2D *this)

{
  UniformGridSampler2D UVar1;
  Vector2D VVar2;
  
  UVar1 = (UniformGridSampler2D)random_uniform();
  VVar2.x = (UniformGridSampler2D)random_uniform();
  *this = UVar1;
  this[1] = VVar2.x;
  VVar2.y = (double)UVar1;
  return VVar2;
}

Assistant:

Vector2D UniformGridSampler2D::get_sample() const {

  return Vector2D(random_uniform(), random_uniform());

}